

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbridge.c
# Opt level: O0

boolean e_jumps(entity *etmp)

{
  boolean bVar1;
  int iVar2;
  int local_1c;
  int tmp;
  entity *etmp_local;
  
  local_1c = 4;
  if (etmp->emon == &youmonst) {
    if ((((u.uprops[0x1f].intrinsic != 0) || (u.uprops[0x1f].extrinsic != 0)) ||
        (u.uprops[0x25].intrinsic != 0)) || (u.uprops[0x25].extrinsic != 0)) {
      return '\0';
    }
  }
  else {
    if ((*(uint *)&etmp->emon->field_0x60 >> 0x12 & 1) == 0) {
      return '\0';
    }
    if ((*(uint *)&etmp->emon->field_0x60 >> 0x13 & 1) != 0) {
      return '\0';
    }
    if (etmp->edata->mmove == '\0') {
      return '\0';
    }
    if (etmp->emon->wormno != '\0') {
      return '\0';
    }
  }
  if (etmp->emon == &youmonst) {
    if (u.uprops[0x1c].intrinsic != 0) {
LAB_0017aa0d:
      local_1c = 2;
    }
  }
  else if ((*(uint *)&etmp->emon->field_0x60 >> 0x15 & 1) != 0) goto LAB_0017aa0d;
  if (etmp->emon == &youmonst) {
    if (((u.uprops[0x1b].intrinsic == 0) && (u.umonnum != 0x9e)) &&
       ((youmonst.data)->mlet != '\x1c')) goto LAB_0017aa7d;
  }
  else if ((*(uint *)&etmp->emon->field_0x60 >> 0x14 & 1) == 0) goto LAB_0017aa7d;
  local_1c = local_1c + -3;
LAB_0017aa7d:
  bVar1 = is_db_wall(etmp->ex,etmp->ey);
  if (bVar1 != '\0') {
    local_1c = local_1c + -2;
  }
  iVar2 = rnd(10);
  return iVar2 <= local_1c;
}

Assistant:

static boolean e_jumps(struct entity *etmp)
{
	int tmp = 4;		/* out of 10 */

	if (is_u(etmp)? (Sleeping || Fumbling) :
		        (!etmp->emon->mcanmove || etmp->emon->msleeping ||
			 !etmp->edata->mmove   || etmp->emon->wormno))
		return FALSE;

	if (is_u(etmp)? Confusion : etmp->emon->mconf)
		tmp -= 2;

	if (is_u(etmp)? Stunned : etmp->emon->mstun)
		tmp -= 3;

	if (is_db_wall(etmp->ex, etmp->ey))
		tmp -= 2;			    /* less room to maneuver */

	return (boolean)((tmp >= rnd(10))? TRUE : FALSE);
}